

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBone(OgreBinarySerializer *this,Skeleton *skeleton)

{
  pointer *pppBVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int8_t *piVar5;
  undefined8 uVar6;
  float *pfVar7;
  iterator __position;
  Bone *pBVar8;
  unsigned_short uVar9;
  Bone *pBVar10;
  Logger *this_00;
  runtime_error *this_01;
  Bone *bone;
  Bone *local_1c8;
  char *local_1c0 [2];
  char local_1b0 [16];
  undefined1 local_1a0 [376];
  
  pBVar10 = (Bone *)operator_new(0xf8);
  Bone::Bone(pBVar10);
  local_1c8 = pBVar10;
  ReadLine_abi_cxx11_((string *)local_1a0,this);
  std::__cxx11::string::operator=((string *)&local_1c8->name,(string *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_);
  }
  uVar9 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  pBVar10 = local_1c8;
  local_1c8->id = uVar9;
  piVar5 = this->m_reader->current;
  StreamReader<false,_false>::SetPtr(this->m_reader,piVar5 + 0xc);
  pBVar8 = local_1c8;
  (pBVar10->position).z = *(float *)(piVar5 + 8);
  uVar6 = *(undefined8 *)piVar5;
  (pBVar10->position).x = (float)(int)uVar6;
  (pBVar10->position).y = (float)(int)((ulong)uVar6 >> 0x20);
  pfVar7 = (float *)this->m_reader->current;
  StreamReader<false,_false>::SetPtr(this->m_reader,(int8_t *)(pfVar7 + 4));
  pBVar10 = local_1c8;
  fVar2 = pfVar7[1];
  fVar3 = pfVar7[2];
  fVar4 = pfVar7[3];
  (pBVar8->rotation).x = *pfVar7;
  (pBVar8->rotation).y = fVar2;
  (pBVar8->rotation).z = fVar3;
  (pBVar8->rotation).w = fVar4;
  if (0x24 < this->m_currentLen) {
    piVar5 = this->m_reader->current;
    StreamReader<false,_false>::SetPtr(this->m_reader,piVar5 + 0xc);
    (pBVar10->scale).z = *(float *)(piVar5 + 8);
    uVar6 = *(undefined8 *)piVar5;
    (pBVar10->scale).x = (float)(int)uVar6;
    (pBVar10->scale).y = (float)(int)((ulong)uVar6 >> 0x20);
  }
  if ((long)(skeleton->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(skeleton->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == (ulong)local_1c8->id) {
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [5])0x758079);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(local_1c8->name)._M_dataplus._M_p,
               (local_1c8->name)._M_string_length);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,local_1c0[0]);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    __position._M_current =
         (skeleton->bones).
         super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (skeleton->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>>::
      _M_realloc_insert<Assimp::Ogre::Bone*const&>
                ((vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>> *)skeleton,
                 __position,&local_1c8);
    }
    else {
      *__position._M_current = local_1c8;
      pppBVar1 = &(skeleton->bones).
                  super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Ogre Skeleton bone indexes not contiguous. Error at bone index ",
             0x3f);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_01,(string *)local_1c0);
  *(undefined ***)this_01 = &PTR__runtime_error_00900168;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadBone(Skeleton *skeleton)
{
    Bone *bone = new Bone();
    bone->name = ReadLine();
    bone->id = Read<uint16_t>();

    // Pos and rot
    ReadVector(bone->position);
    ReadQuaternion(bone->rotation);

    // Scale (optional)
    if (m_currentLen > MSTREAM_BONE_SIZE_WITHOUT_SCALE)
        ReadVector(bone->scale);

    // Bone indexes need to start from 0 and be contiguous
    if (bone->id != skeleton->bones.size()) {
        throw DeadlyImportError(Formatter::format() << "Ogre Skeleton bone indexes not contiguous. Error at bone index " << bone->id);
    }

    ASSIMP_LOG_DEBUG_F( "    ", bone->id, " ", bone->name);

    skeleton->bones.push_back(bone);
}